

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib536.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  undefined8 uVar2;
  CURLM *multi;
  long lVar3;
  undefined8 uVar4;
  char *pcVar5;
  undefined8 uVar6;
  
  tv_test_start = tutil_tvnow();
  iVar1 = curl_global_init(3);
  uVar6 = _stderr;
  if (iVar1 != 0) {
    uVar2 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar6,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib536.c"
                  ,0x56,iVar1,uVar2);
    goto LAB_001024c2;
  }
  multi = (CURLM *)curl_multi_init();
  if (multi == (CURLM *)0x0) {
    lVar3 = 0;
    curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib536.c"
                  ,0x58);
    iVar1 = 0x7b;
  }
  else {
    lVar3 = curl_easy_init();
    if (lVar3 == 0) {
      lVar3 = 0;
      curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib536.c"
                    ,0x5a);
      iVar1 = 0x7c;
    }
    else {
      iVar1 = curl_multi_setopt(multi,3,1);
      uVar6 = _stderr;
      if (iVar1 == 0) {
        iVar1 = curl_easy_setopt(lVar3,0x4e2b,fwrite);
        uVar6 = _stderr;
        if (iVar1 == 0) {
          iVar1 = curl_easy_setopt(lVar3,0x2d,1);
          uVar6 = _stderr;
          if (iVar1 == 0) {
            iVar1 = curl_easy_setopt(lVar3,0x2712,URL);
            uVar6 = _stderr;
            if (iVar1 == 0) {
              iVar1 = curl_multi_add_handle(multi,lVar3);
              uVar6 = _stderr;
              if (iVar1 == 0) {
                iVar1 = perform(multi);
                if (iVar1 == 0) {
                  curl_multi_remove_handle(multi,lVar3);
                  curl_easy_reset(lVar3);
                  iVar1 = curl_easy_setopt(lVar3,0x2d,1);
                  uVar6 = _stderr;
                  if (iVar1 == 0) {
                    iVar1 = curl_easy_setopt(lVar3,0x2712,libtest_arg2);
                    uVar6 = _stderr;
                    if (iVar1 == 0) {
                      iVar1 = curl_multi_add_handle(multi,lVar3);
                      uVar6 = _stderr;
                      if (iVar1 == 0) {
                        iVar1 = perform(multi);
                        if (iVar1 == 0) {
                          curl_multi_remove_handle(multi,lVar3);
                          iVar1 = 0;
                          goto LAB_0010249f;
                        }
                        pcVar5 = "retrieve 2 failed\n";
                      }
                      else {
                        uVar2 = curl_multi_strerror(iVar1);
                        curl_mfprintf(uVar6,
                                      "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib536.c"
                                      ,0x75,iVar1,uVar2);
                        pcVar5 = "curl_multi_add_handle() 2 failed\n";
                      }
                      goto LAB_00102532;
                    }
                    uVar2 = curl_easy_strerror(iVar1);
                    pcVar5 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                    uVar4 = 0x73;
                  }
                  else {
                    uVar2 = curl_easy_strerror(iVar1);
                    pcVar5 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
                    uVar4 = 0x72;
                  }
                  goto LAB_00102492;
                }
                pcVar5 = "retrieve 1 failed\n";
              }
              else {
                uVar2 = curl_multi_strerror(iVar1);
                curl_mfprintf(uVar6,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib536.c"
                              ,0x62,iVar1,uVar2);
                pcVar5 = "curl_multi_add_handle() 1 failed\n";
              }
LAB_00102532:
              curl_mprintf(pcVar5);
              goto LAB_0010249f;
            }
            uVar2 = curl_easy_strerror(iVar1);
            pcVar5 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
            uVar4 = 0x60;
          }
          else {
            uVar2 = curl_easy_strerror(iVar1);
            pcVar5 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
            uVar4 = 0x5f;
          }
        }
        else {
          uVar2 = curl_easy_strerror(iVar1);
          pcVar5 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
          uVar4 = 0x5e;
        }
      }
      else {
        uVar2 = curl_multi_strerror(iVar1);
        pcVar5 = "%s:%d curl_multi_setopt() failed, with code %d (%s)\n";
        uVar4 = 0x5c;
      }
LAB_00102492:
      curl_mfprintf(uVar6,pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/pelya[P]curl/tests/libtest/lib536.c"
                    ,uVar4,iVar1,uVar2);
    }
  }
LAB_0010249f:
  curl_easy_cleanup(lVar3);
  curl_multi_cleanup(multi);
  curl_global_cleanup();
  curl_mprintf("Finished!\n");
LAB_001024c2:
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURLM *multi = NULL;
  CURL *easy = NULL;
  int res = 0;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  multi_init(multi);

  easy_init(easy);

  multi_setopt(multi, CURLMOPT_PIPELINING, 1L);

  easy_setopt(easy, CURLOPT_WRITEFUNCTION, fwrite);
  easy_setopt(easy, CURLOPT_FAILONERROR, 1L);
  easy_setopt(easy, CURLOPT_URL, URL);

  res_multi_add_handle(multi, easy);
  if(res) {
    printf("curl_multi_add_handle() 1 failed\n");
    goto test_cleanup;
  }

  res = perform(multi);
  if(res) {
    printf("retrieve 1 failed\n");
    goto test_cleanup;
  }

  curl_multi_remove_handle(multi, easy);

  curl_easy_reset(easy);

  easy_setopt(easy, CURLOPT_FAILONERROR, 1L);
  easy_setopt(easy, CURLOPT_URL, libtest_arg2);

  res_multi_add_handle(multi, easy);
  if(res) {
    printf("curl_multi_add_handle() 2 failed\n");
    goto test_cleanup;
  }

  res = perform(multi);
  if(res) {
    printf("retrieve 2 failed\n");
    goto test_cleanup;
  }

  curl_multi_remove_handle(multi, easy);

test_cleanup:

  /* undocumented cleanup sequence - type UB */

  curl_easy_cleanup(easy);
  curl_multi_cleanup(multi);
  curl_global_cleanup();

  printf("Finished!\n");

  return res;
}